

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlXPathContextPtr xmlXPathNewContext(xmlDocPtr doc)

{
  xmlXPathContextPtr __s;
  
  __s = (xmlXPathContextPtr)(*xmlMalloc)(0x178);
  if (__s == (xmlXPathContextPtr)0x0) {
    __s = (xmlXPathContextPtr)0x0;
  }
  else {
    memset(__s,0,0x178);
    __s->doc = doc;
    __s->node = (xmlNodePtr)0x0;
    __s->nsHash = (xmlHashTablePtr)0x0;
    __s->user = (void *)0x0;
    __s->varHash = (xmlHashTablePtr)0x0;
    __s->nb_types = 0;
    __s->max_types = 0;
    __s->types = (xmlXPathTypePtr)0x0;
    __s->nb_axis = 0;
    __s->max_axis = 0;
    __s->axis = (xmlXPathAxisPtr)0x0;
    __s->contextSize = 1;
    __s->proximityPosition = 1;
  }
  return __s;
}

Assistant:

xmlXPathContextPtr
xmlXPathNewContext(xmlDocPtr doc) {
    xmlXPathContextPtr ret;

    ret = (xmlXPathContextPtr) xmlMalloc(sizeof(xmlXPathContext));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0 , sizeof(xmlXPathContext));
    ret->doc = doc;
    ret->node = NULL;

    ret->varHash = NULL;

    ret->nb_types = 0;
    ret->max_types = 0;
    ret->types = NULL;

    ret->nb_axis = 0;
    ret->max_axis = 0;
    ret->axis = NULL;

    ret->nsHash = NULL;
    ret->user = NULL;

    ret->contextSize = 1;
    ret->proximityPosition = 1;

#ifdef XP_DEFAULT_CACHE_ON
    if (xmlXPathContextSetCache(ret, 1, -1, 0) == -1) {
	xmlXPathFreeContext(ret);
	return(NULL);
    }
#endif

    return(ret);
}